

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall higan::Channel::HandleEvent(Channel *this)

{
  bool bVar1;
  LogLevel LVar2;
  undefined8 uVar3;
  Fmt local_328;
  Logger local_228;
  Channel *local_10;
  Channel *this_local;
  
  local_10 = this;
  if ((this->connecting_ & 1U) == 0) {
    LVar2 = Logger::GetLogLevel();
    if ((int)LVar2 < 4) {
      Logger::Logger(&local_228,ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/Channel.cpp"
                     ,99,"HandleEvent");
      uVar3 = std::__cxx11::string::c_str();
      Fmt::Fmt(&local_328,"connection: %s closed!!!!!",uVar3);
      Logger::operator<<(&local_228,&local_328);
      Logger::~Logger(&local_228);
    }
  }
  else if ((this->channel_error_ & 1U) == 0) {
    if (((this->channel_readable_ & 1U) != 0) &&
       (bVar1 = std::function::operator_cast_to_bool((function *)&this->readable_callback_), bVar1))
    {
      std::function<void_()>::operator()(&this->readable_callback_);
    }
    if (((this->channel_writable_ & 1U) != 0) &&
       (bVar1 = std::function::operator_cast_to_bool((function *)&this->writable_callback_), bVar1))
    {
      std::function<void_()>::operator()(&this->writable_callback_);
    }
  }
  else {
    this->connecting_ = false;
    bVar1 = std::function::operator_cast_to_bool((function *)&this->error_callback_);
    if (bVar1) {
      std::function<void_()>::operator()(&this->error_callback_);
    }
  }
  return;
}

Assistant:

void Channel::HandleEvent()
{
	if (!connecting_)
	{
		LOG_ERROR << higan::Fmt("connection: %s closed!!!!!", connection_name_.c_str());
		return;
	}

	if (channel_error_)
	{
		/**
		 * 默认在 错误和可读同时触发时执行错误回调
		 * 是否会丢失数据?
		 */
		connecting_ = false;
		if (error_callback_)
		{
			error_callback_();
		}
		return;
	}

	if (channel_readable_)
	{
		if (readable_callback_)
		{
			readable_callback_();
		}
	}

	if (channel_writable_)
	{
		if (writable_callback_)
		{
			writable_callback_();
		}
	}
}